

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

int isFrameExtentsEvent(Display *display,XEvent *event,XPointer pointer)

{
  _GLFWwindow *window;
  
  if (((event->type == 0x1c) && ((event->xexpose).count == 0)) &&
     ((event->xany).window == *(Window *)(pointer + 0x358))) {
    return (int)((event->xkey).root == _glfw.x11.NET_FRAME_EXTENTS);
  }
  return 0;
}

Assistant:

static Bool isFrameExtentsEvent(Display* display, XEvent* event, XPointer pointer)
{
    _GLFWwindow* window = (_GLFWwindow*) pointer;
    return event->type == PropertyNotify &&
           event->xproperty.state == PropertyNewValue &&
           event->xproperty.window == window->x11.handle &&
           event->xproperty.atom == _glfw.x11.NET_FRAME_EXTENTS;
}